

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resldexe.cpp
# Opt level: O0

osfildef * __thiscall CResLoader::open_lib_res(CResLoader *this,char *libfile,char *respath)

{
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  char *in_RSI;
  CVmImageLoaderMres_resload res_ifc;
  osfildef *fp;
  CVmImageLoaderMres *in_stack_000000a0;
  char *in_stack_000000a8;
  osfildef *in_stack_000000b0;
  char *in_stack_ffffffffffffff58;
  FILE *in_stack_ffffffffffffff60;
  CVmImageLoaderMres_resload local_58;
  FILE *local_28;
  FILE *local_8;
  
  local_28 = fopen(in_RSI,"rb");
  if (local_28 == (FILE *)0x0) {
    local_8 = (FILE *)0x0;
  }
  else {
    CVmImageLoaderMres_resload::CVmImageLoaderMres_resload
              ((CVmImageLoaderMres_resload *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    CVmImageLoader::load_resources_from_fp(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
    iVar1 = CVmImageLoaderMres_resload::found_resource(&local_58);
    if (iVar1 == 0) {
      fclose(local_28);
      local_8 = (FILE *)0x0;
    }
    else {
      pcVar3 = CVmImageLoaderMres_resload::get_link_fname(&local_58);
      if (pcVar3 == (char *)0x0) {
        in_stack_ffffffffffffff60 = local_28;
        uVar2 = CVmImageLoaderMres_resload::get_resource_seek(&local_58);
        fseek(in_stack_ffffffffffffff60,(ulong)uVar2,0);
      }
      else {
        fclose(local_28);
        pcVar3 = CVmImageLoaderMres_resload::get_link_fname(&local_58);
        local_28 = fopen(pcVar3,"rb");
      }
      local_8 = local_28;
    }
    CVmImageLoaderMres_resload::~CVmImageLoaderMres_resload
              ((CVmImageLoaderMres_resload *)in_stack_ffffffffffffff60);
  }
  return (osfildef *)local_8;
}

Assistant:

osfildef *CResLoader::open_lib_res(const char *libfile,
                                   const char *respath)
{
    osfildef *fp;

    /* try opening the file */
    fp = osfoprb(libfile, OSFTT3IMG);
    
    /* if we couldn't open the file, we can't load the resource */
    if (fp == 0)
        return 0;

    /* set up a resource finder for our resource */
    CVmImageLoaderMres_resload res_ifc(respath);
    
    /* load the file, so that we can try finding the resource */
    CVmImageLoader::load_resources_from_fp(fp, libfile, &res_ifc);
    
    /* check to see if we found it */
    if (res_ifc.found_resource())
    {
        /* we got it - check the type */
        if (res_ifc.get_link_fname() != 0)
        {
            /* 
             *   linked local file - close the library file and open the
             *   local file instead 
             */
            osfcls(fp);
            fp = osfoprb(res_ifc.get_link_fname(), OSFOPRB);
        }
        else
        {
            /* embedded resource - seek to the first byte */
            osfseek(fp, res_ifc.get_resource_seek(), OSFSK_SET);
        }

        /* return the library file handle */
        return fp;
    }
    else
    {
        /* didn't find the resource - close the library */
        osfcls(fp);

        /* tell the caller we didn't find the resource */
        return 0;
    }
}